

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpperf.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  undefined8 uVar2;
  __u8 _Var3;
  uint __i;
  uint uVar4;
  uint __fd;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int canfd_on;
  uint local_1f8;
  uint local_1f4;
  ulong local_1f0;
  ulong local_1e8;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  uint local_194;
  undefined8 local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  long local_170;
  ulong local_168;
  ulong local_160;
  timeval start_tv;
  canfd_frame frame;
  timeval timeo;
  timeval end_tv;
  sockaddr_can addr;
  uint local_c8;
  undefined4 local_c4;
  uint local_c0;
  undefined4 local_bc;
  fd_set rdfs;
  
  canfd_on = 1;
  local_1a8 = 0;
  local_1e8 = CONCAT44(local_1e8._4_4_,0xffffffff);
  local_1d8 = 0;
  local_1dc = 0;
  local_1d4 = 0;
  local_1f4 = 0xffffffff;
  while( true ) {
    while( true ) {
      uVar4 = getopt(argc,argv,"s:d:x:X:?");
      if (uVar4 != 0x58) break;
      uVar7 = strtoul(_optarg,(char **)0x0,0x10);
      local_1d4 = (uint)uVar7 & 0xff;
      local_1dc = 1;
    }
    if (uVar4 == 0xffffffff) break;
    if (uVar4 == 100) {
      local_1a0 = strtoul(_optarg,(char **)0x0,0x10);
      sVar8 = strlen(_optarg);
      local_1f4 = (uint)local_1a0 | 0x80000000;
      if (sVar8 < 8) {
        local_1f4 = (uint)local_1a0;
      }
    }
    else if (uVar4 == 0x73) {
      local_1e8 = strtoul(_optarg,(char **)0x0,0x10);
      sVar8 = strlen(_optarg);
      uVar4 = (uint)local_1e8 | 0x80000000;
      if (sVar8 < 8) {
        uVar4 = (uint)local_1e8;
      }
      local_1e8 = CONCAT44(local_1e8._4_4_,uVar4);
    }
    else {
      if (uVar4 != 0x78) {
        if (uVar4 != 0x3f) {
          fprintf(_stderr,"Unknown option %c\n",(ulong)uVar4);
          pcVar12 = __xpg_basename(*argv);
          print_usage(pcVar12);
          exit(1);
        }
LAB_00101c9b:
        pcVar12 = __xpg_basename(*argv);
        print_usage(pcVar12);
        exit(0);
      }
      uVar7 = strtoul(_optarg,(char **)0x0,0x10);
      local_1d8 = (uint)uVar7 & 0xff;
      local_1a8 = 1;
    }
  }
  uVar4 = (uint)local_1e8;
  if (((argc - _optind != 1) || ((uint)local_1e8 == 0xffffffff)) || (local_1f4 == 0xffffffff))
  goto LAB_00101c9b;
  __fd = socket(0x1d,3,1);
  if ((int)__fd < 0) {
    pcVar12 = "socket";
  }
  else {
    setsockopt(__fd,0x65,5,&canfd_on,4);
    local_c8 = 0x9fffffff;
    if (-1 < (int)uVar4) {
      local_c8 = 0x7ff;
    }
    local_c4 = 0xdfffffff;
    if (-1 < (int)uVar4) {
      local_c4 = 0xc00007ff;
    }
    local_c8 = local_c8 & uVar4;
    local_c0 = 0x9fffffff;
    if (-1 < (int)local_1f4) {
      local_c0 = 0x7ff;
    }
    local_bc = 0xdfffffff;
    if (-1 < (int)local_1f4) {
      local_bc = 0xc00007ff;
    }
    local_c0 = local_c0 & local_1f4;
    uVar7 = 1;
    setsockopt(__fd,0x65,1,&local_c8,0x10);
    addr.can_family = 0x1d;
    addr.can_ifindex = if_nametoindex(argv[_optind]);
    if (addr.can_ifindex == 0) {
      pcVar12 = "if_nametoindex";
    }
    else {
      iVar5 = bind(__fd,(sockaddr *)&addr,0x18);
      if (-1 < iVar5) {
        local_1e8 = 1L << ((byte)__fd & 0x3f);
        local_1a0 = CONCAT44(local_1a0._4_4_,__fd + 1);
        local_180 = (ulong)local_1dc;
        local_160 = local_180 | 2;
        local_178 = local_1a8 & 0xffffffff;
        local_1c0 = local_178 + 1;
        local_1c8 = local_178 | 2;
        local_168 = local_178 | 4;
        local_194 = (uint)local_1a8 | 6;
        local_170 = (long)(int)~(uint)local_1a8;
        local_188 = 0;
        local_190 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        local_1f0 = 0;
        local_1e0 = 0;
        uVar16 = 0;
        local_1d0 = 0;
        bVar17 = false;
        uVar4 = __fd;
        local_1f8 = __fd;
LAB_0010164f:
        while( true ) {
          while( true ) {
            do {
              if (bVar17) {
                close(uVar4);
                return (int)uVar7;
              }
              for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
                rdfs.fds_bits[lVar9] = 0;
              }
              rdfs.fds_bits[__fd >> 6] = rdfs.fds_bits[__fd >> 6] | local_1e8;
              timeo.tv_sec = 1;
              timeo.tv_usec = 0;
              uVar6 = select((int)local_1a0,(fd_set *)&rdfs,(fd_set *)0x0,(fd_set *)0x0,
                             (timeval *)&timeo);
              uVar7 = (ulong)uVar6;
              bVar17 = true;
            } while ((int)uVar6 < 0);
            if ((uVar16 == 0) || ((rdfs.fds_bits[__fd >> 6] & local_1e8) != 0)) break;
            local_1f0 = 0;
            printf("\r%-*s",0x4e," (transmission timed out)");
            fflush(_stdout);
            uVar16 = 0;
            bVar17 = false;
          }
          uVar10 = read(uVar4,&frame,0x48);
          _Var3 = frame.len;
          uVar4 = local_1f8;
          if (-1 < (int)(uint)uVar10) break;
          perror("read");
LAB_0010193c:
          uVar7 = uVar10 & 0xffffffff;
          uVar4 = local_1f8;
        }
        uVar6 = (uint)uVar10 & 0x7fffffff;
        if ((uVar6 != 0x10) && (uVar6 != 0x48)) {
          fprintf(_stderr,"read: incomplete CAN frame %zu %d\n",0x48);
          goto LAB_0010193c;
        }
        if (uVar16 != 0) goto code_r0x00101711;
        goto LAB_0010173e;
      }
      pcVar12 = "bind";
    }
  }
  perror(pcVar12);
  return 1;
code_r0x00101711:
  bVar17 = false;
  if ((uVar6 != 0x48 && canfd_on != 0) || (uVar6 != 0x10 && canfd_on == 0)) goto LAB_0010164f;
LAB_0010173e:
  if (((int)local_1a8 != 0) && (bVar17 = false, local_1d8 != frame.data[0])) goto LAB_0010164f;
  if (frame.can_id == local_1f4) {
    if (((local_1dc != 0) && (bVar17 = false, local_1d4 != frame.data[0])) ||
       (bVar17 = false, (frame.data[local_180] & 0xf0) != 0x30)) goto LAB_0010164f;
    local_188 = CONCAT71((int7)(local_180 >> 8),frame.data[local_180 + 1]);
    local_190 = CONCAT71((int7)(local_160 >> 8),frame.data[local_160]);
  }
  bVar1 = frame.data[local_178];
  uVar13 = bVar1 & 0xfffffff0;
  if (uVar13 == 0x20) {
    if (uVar16 != 0) {
      uVar4 = bVar1 & 0xf;
      if (uVar4 == ((int)local_1d0 + 1U & 0xf)) {
        uVar16 = uVar16 + local_170 + (ulong)frame.len;
        local_1d0 = (ulong)uVar4;
        goto LAB_00101a3f;
      }
      goto LAB_00101a48;
    }
  }
  else {
    if (uVar13 == 0x10) {
      uVar13 = (uint)frame.data[local_1c0] | (bVar1 & 0xf) << 8;
      if (uVar13 == 0) {
        uVar10 = (ulong)frame.data[local_178 + 5] |
                 (ulong)frame.data[local_168] << 8 |
                 (long)(int)((uint)frame.data[local_1c8] << 0x18) |
                 (ulong)frame.data[local_178 + 3] << 0x10;
        uVar13 = local_194;
        if (0x418936 < (uint)uVar10) {
          uVar16 = 0;
          printf("fflen %lu is more than ~4.2 MB - ignoring PDU\n");
          fflush(_stdout);
          local_1f0 = 0;
          bVar17 = false;
          goto LAB_0010164f;
        }
      }
      else {
        uVar10 = (ulong)uVar13;
        uVar13 = (uint)local_1c8;
      }
      local_1b0 = (ulong)frame.len;
      uVar16 = (ulong)(int)(frame.len - uVar13);
      local_1f0 = uVar10;
      local_1e0 = getdigits((uint)uVar10);
      local_1b8 = CONCAT71((int7)(CONCAT44(extraout_var_00,local_1e0) >> 8),frame.flags) &
                  0xffffffffffffff01;
      ioctl(uVar4,0x8906,&start_tv);
      canfd_on = (int)(uVar6 != 0x10);
      local_1d0 = 0;
    }
    else if ((bVar1 & 0xf0) == 0) {
      uVar11 = (ulong)bVar1 & 0xf;
      uVar10 = local_1c0;
      if ((bVar1 & 0xf) == 0) {
        uVar11 = (ulong)frame.data[local_1c0];
        uVar10 = local_1c8;
      }
      uVar14 = (ulong)frame.len;
      uVar16 = 0;
      if (uVar10 + uVar11 <= uVar14) {
        uVar16 = uVar11;
      }
      local_1e0 = getdigits((uint)uVar16);
      local_1b8 = CONCAT71((int7)(CONCAT44(extraout_var,local_1e0) >> 8),frame.flags) &
                  0xffffffffffffff01;
      if (_Var3 < 9) {
        uVar14 = 8;
      }
      local_1b0 = uVar14;
      ioctl(uVar4,0x8906,&start_tv);
      local_1f0 = uVar16;
      if (uVar6 == 0x10) {
        canfd_on = 0;
      }
      else {
        canfd_on = 1;
      }
    }
LAB_00101a3f:
    if (uVar16 != 0) {
LAB_00101a48:
      uVar10 = local_1f0;
      if (uVar16 < local_1f0) {
        uVar10 = uVar16;
      }
      uVar4 = 0;
      uVar11 = (uVar10 * 100) / local_1f0;
      printf("\r %3lu%% ",uVar11,(uVar10 * 100) % local_1f0);
      putchar(0x7c);
      if (99 < uVar11) {
        uVar11 = 100;
      }
      for (; uVar14 = local_1f0, uVar4 != 0x32; uVar4 = uVar4 + 1) {
        iVar5 = 0x2e;
        if (uVar4 < ((uint)(uVar11 >> 1) & 0x7fffffff)) {
          iVar5 = 0x58;
        }
        putchar(iVar5);
      }
      printf("| %*lu/%lu ",(ulong)local_1e0,uVar10);
      bVar17 = uVar16 < uVar14;
      uVar16 = uVar10;
      if (bVar17) goto LAB_00101c3b;
      pcVar12 = "CAN-FD";
      if (canfd_on == 0) {
        pcVar12 = "CAN2.0";
      }
      uVar2 = 0x2a;
      if ((char)local_1b8 == '\0') {
        uVar2 = 0x20;
      }
      printf("\r%s %02d%c (BS:%2hhu # ",pcVar12,local_1b0 & 0xff,uVar2,local_188 & 0xff);
      uVar4 = local_1f8;
      if ((char)local_190 < '\0') {
        if ((byte)((char)local_190 + 0xfU) < 9) {
          printf("STmin:%3u usec)",(ulong)(((uint)local_190 & 0xf) * 100));
        }
        else {
          printf("STmin: invalid   )");
        }
      }
      else {
        printf("STmin:%3hhu msec)");
        uVar4 = local_1f8;
      }
      printf(" : %lu byte in ",uVar14);
      ioctl(uVar4,0x8906,&end_tv);
      lVar15 = end_tv.tv_usec - start_tv.tv_usec;
      lVar9 = lVar15 + 1000000;
      if (-1 < lVar15) {
        lVar9 = lVar15;
      }
      lVar15 = (lVar15 >> 0x3f) + (end_tv.tv_sec - start_tv.tv_sec);
      if (lVar15 < 0) {
        lVar9 = 0;
      }
      if (lVar15 < 1) {
        lVar15 = 0;
      }
      uVar16 = lVar9 / 1000 + lVar15 * 1000;
      if (uVar16 == 0) {
        printf("(no time available)     ",lVar15,lVar9 % 1000);
      }
      else {
        printf("%llu.%06llus ",lVar15,lVar9);
        printf("=> %lu byte/s",(uVar14 * 1000) / uVar16,(uVar14 * 1000) % uVar16);
      }
      putchar(10);
      local_1f0 = 0;
    }
  }
  uVar16 = 0;
LAB_00101c3b:
  fflush(_stdout);
  bVar17 = false;
  uVar4 = local_1f8;
  goto LAB_0010164f;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int s;
	int running = 1;
	struct sockaddr_can addr;
	struct can_filter rfilter[2];
	struct canfd_frame frame;
	int canfd_on = 1;
	int nbytes, i, ret;
	canid_t src = NO_CAN_ID;
	canid_t dst = NO_CAN_ID;
	int ext = 0;
	int extaddr = 0;
	int rx_ext = 0;
	int rx_extaddr = 0;
	int datidx = 0;
	unsigned char bs = 0;
	unsigned char stmin = 0;
	unsigned char brs = 0;
	unsigned char ll_dl = 0;
	unsigned long fflen = 0;
	unsigned fflen_digits = 0;
	unsigned long rcvlen = 0;
	unsigned long percent = 0;
	struct timeval start_tv, end_tv, diff_tv, timeo;
	unsigned int n_pci;
	unsigned int sn, last_sn = 0;
	int opt;

	while ((opt = getopt(argc, argv, "s:d:x:X:?")) != -1) {
		switch (opt) {
		case 's':
			src = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				src |= CAN_EFF_FLAG;
			break;

		case 'd':
			dst = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				dst |= CAN_EFF_FLAG;
			break;

		case 'x':
			ext = 1;
			extaddr = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'X':
			rx_ext = 1;
			rx_extaddr = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind) != 1 || src == NO_CAN_ID || dst == NO_CAN_ID) {
		print_usage(basename(argv[0]));
		exit(0);
	}

	if ((s = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
		perror("socket");
		return 1;
	}

	/* try to switch the socket into CAN FD mode */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &canfd_on, sizeof(canfd_on));

	/* set single CAN ID raw filters for src and dst frames */
	if (src & CAN_EFF_FLAG) {
		rfilter[0].can_id   = src & (CAN_EFF_MASK | CAN_EFF_FLAG);
		rfilter[0].can_mask = (CAN_EFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	} else {
		rfilter[0].can_id   = src & CAN_SFF_MASK;
		rfilter[0].can_mask = (CAN_SFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	}

	if (dst & CAN_EFF_FLAG) {
		rfilter[1].can_id   = dst & (CAN_EFF_MASK | CAN_EFF_FLAG);
		rfilter[1].can_mask = (CAN_EFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	} else {
		rfilter[1].can_id   = dst & CAN_SFF_MASK;
		rfilter[1].can_mask = (CAN_SFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	}

	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, &rfilter, sizeof(rfilter));

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[optind]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	while (running) {

		FD_ZERO(&rdfs);
		FD_SET(s, &rdfs);

		/* timeout for ISO TP transmissions */
		timeo.tv_sec  = 1;
		timeo.tv_usec = 0;

		if ((ret = select(s+1, &rdfs, NULL, NULL, &timeo)) < 0) {
			running = 0;
			continue;
		}

		/* detected timeout of already started transmission */
		if (rcvlen && !(FD_ISSET(s, &rdfs))) {
			printf("\r%-*s",78, " (transmission timed out)");
			fflush(stdout);
			fflen = rcvlen = 0;
			continue;
		}

		nbytes = read(s, &frame, sizeof(frame));
		if (nbytes < 0) {
			perror("read");
			ret = nbytes;
			running = 0;
			continue;
		}
		if (nbytes != CAN_MTU && nbytes != CANFD_MTU) {
			fprintf(stderr, "read: incomplete CAN frame %zu %d\n", sizeof(frame), nbytes);
			ret = nbytes;
			running = 0;
			continue;
		}

		if (rcvlen) {
			/* make sure to process only the detected PDU CAN frame type */
			if (canfd_on && (nbytes != CANFD_MTU))
				continue;
			if (!canfd_on && (nbytes != CAN_MTU))
				continue;
		}

			/* check extended address if provided */
			if (ext && extaddr != frame.data[0])
				continue;

			/* only get flow control information from dst CAN ID */
			if (frame.can_id == dst) {
				/* check extended address if provided */
				if (rx_ext && frame.data[0] != rx_extaddr)
					continue;

				n_pci = frame.data[rx_ext];
				/* check flow control PCI only */
				if ((n_pci & 0xF0) != 0x30)
					continue;

				bs = frame.data[rx_ext + 1];
				stmin = frame.data[rx_ext + 2];
			}

			/* data content starts and index datidx */
			datidx = 0;

			n_pci = frame.data[ext];
			switch (n_pci & 0xF0) {

			case 0x00:
				/* SF */
				if (n_pci & 0xF) {
					fflen = rcvlen = n_pci & 0xF;
					datidx = ext+1;
				} else {
					fflen = rcvlen = frame.data[ext + 1];
					datidx = ext+2;
				}

				/* ignore incorrect SF PDUs */
				if (frame.len < rcvlen + datidx)
					fflen = rcvlen = 0;

				/* get number of digits for printing */
				fflen_digits = getdigits(fflen);

				/* get CAN FD bitrate & LL_DL setting information */
				brs = frame.flags & CANFD_BRS;
				ll_dl = frame.len;
				if (ll_dl < 8)
					ll_dl = 8;

				ioctl(s, SIOCGSTAMP, &start_tv);

				/* determine CAN frame mode for this PDU */
				if (nbytes == CAN_MTU)
					canfd_on = 0;
				else
					canfd_on = 1;

				break;

			case 0x10:
				/* FF */
				fflen = ((n_pci & 0x0F)<<8) + frame.data[ext+1];
				if (fflen)
					datidx = ext+2;
				else {
					fflen = (frame.data[ext+2]<<24) +
						(frame.data[ext+3]<<16) +
						(frame.data[ext+4]<<8) +
						frame.data[ext+5];
					datidx = ext+6;
				}

				/* to increase the time resolution we multiply fflen with 1000 later */
				if (fflen >= (UINT32_MAX / 1000)) {
					printf("fflen %lu is more than ~4.2 MB - ignoring PDU\n", fflen);
					fflush(stdout);
					fflen = rcvlen = 0;
					continue;
				}
				rcvlen = frame.len - datidx;
				last_sn = 0;

				/* get number of digits for printing */
				fflen_digits = getdigits(fflen);

				/* get CAN FD bitrate & LL_DL setting information */
				brs = frame.flags & CANFD_BRS;
				ll_dl = frame.len;

				ioctl(s, SIOCGSTAMP, &start_tv);

				/* determine CAN frame mode for this PDU */
				if (nbytes == CAN_MTU)
					canfd_on = 0;
				else
					canfd_on = 1;

				break;

			case 0x20:
				/* CF */
				if (rcvlen) {
					sn = n_pci & 0x0F;
					if (sn == ((last_sn + 1) & 0xF)) {
						last_sn = sn;
						datidx = ext+1;
						rcvlen += frame.len - datidx;
					}
				}
				break;

			default:
				break;
			}

			/* PDU reception in process */
			if (rcvlen) {
				if (rcvlen > fflen)
					rcvlen = fflen;

				percent = (rcvlen * 100 / fflen);
				printf("\r %3lu%% ", percent);

				printf("|");

				if (percent > 100)
					percent = 100;

				for (i=0; i < NUMBAR; i++){
					if (i < (int)(percent/PERCENTRES))
						printf("X");
					else
						printf(".");
				}
				printf("| %*lu/%lu ", fflen_digits, rcvlen, fflen);
			}

			/* PDU complete */
			if (rcvlen && rcvlen >= fflen) {

				printf("\r%s %02d%c (BS:%2hhu # ", canfd_on?"CAN-FD":"CAN2.0", ll_dl, brs?'*':' ', bs);
				if (stmin < 0x80)
					printf("STmin:%3hhu msec)", stmin);
				else if (stmin > 0xF0 && stmin < 0xFA)
					printf("STmin:%3u usec)", (stmin & 0xF) * 100);
				else
					printf("STmin: invalid   )");

				printf(" : %lu byte in ", fflen);

				/* calculate time */
				ioctl(s, SIOCGSTAMP, &end_tv);
				diff_tv.tv_sec  = end_tv.tv_sec  - start_tv.tv_sec;
				diff_tv.tv_usec = end_tv.tv_usec - start_tv.tv_usec;
				if (diff_tv.tv_usec < 0)
					diff_tv.tv_sec--, diff_tv.tv_usec += 1000000;
				if (diff_tv.tv_sec < 0)
					diff_tv.tv_sec = diff_tv.tv_usec = 0;

				/* check devisor to be not zero */
				if (diff_tv.tv_sec * 1000 + diff_tv.tv_usec / 1000){
					printf("%llu.%06llus ", (unsigned long long)diff_tv.tv_sec, (unsigned long long)diff_tv.tv_usec);
					printf("=> %lu byte/s", (fflen * 1000) /
					       (unsigned long)(diff_tv.tv_sec * 1000 + diff_tv.tv_usec / 1000));
				} else
					printf("(no time available)     ");

				printf("\n");
				/* wait for next PDU */
				fflen = rcvlen = 0;
			}
			fflush(stdout);
	}

	close(s);

	return ret;
}